

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderTextureImageSamplesTests.cpp
# Opt level: O3

void __thiscall
glcts::ShaderTextureImageSamplesTestBase::executeFunctionalTest
          (ShaderTextureImageSamplesTestBase *this,_sampler_type *sampler_type,_test_type *test_type
          )

{
  GLuint *pGVar1;
  ostringstream *this_00;
  _sampler_type _Var2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  ulong uVar6;
  undefined4 extraout_var;
  GLint *pGVar8;
  int *piVar9;
  TestError *pTVar10;
  char *pcVar11;
  undefined4 uVar12;
  long lVar13;
  _test_type *p_Var14;
  string sampler_type_string;
  string sampler_type_token;
  string samples_modifier_token_value;
  string samples_modifier_token;
  string cs_body;
  string sampler_type_token_value;
  int max_image_samples;
  undefined4 local_294;
  char *local_280;
  char *local_278;
  char local_270;
  undefined7 uStack_26f;
  _test_type *local_260;
  GLint *local_258;
  long *local_250;
  char *local_248;
  long local_240 [2];
  undefined1 *local_230;
  char *local_228;
  undefined1 local_220;
  undefined7 uStack_21f;
  long *local_210;
  char *local_208;
  long local_200 [2];
  char *local_1f0;
  char *local_1e8;
  char local_1e0;
  undefined7 uStack_1df;
  undefined1 *local_1d0;
  char *local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  local_1f0 = &local_1e0;
  local_1e8 = (char *)0x0;
  local_1e0 = '\0';
  local_260 = test_type;
  deinitProgramAndShaderObjects(this);
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"SAMPLES_MODIFIER","");
  local_230 = &local_220;
  local_228 = (char *)0x0;
  local_220 = 0;
  local_280 = &local_270;
  local_278 = (char *)0x0;
  local_270 = '\0';
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"SAMPLER_TYPE","");
  local_1d0 = &local_1c0;
  local_1c8 = (char *)0x0;
  local_1c0 = 0;
  if (*local_260 == TEST_TYPE_IMAGE) {
    std::__cxx11::string::_M_replace((ulong)&local_230,0,local_228,0x1aadd32);
    switch(*sampler_type) {
    case SAMPLER_TYPE_ISAMPLER2DMS:
      std::__cxx11::string::_M_replace((ulong)&local_280,0,local_278,0x1aadd5e);
      pcVar11 = "layout(rgba8i) uniform iimage2DMS";
      break;
    case SAMPLER_TYPE_ISAMPLER2DMSARRAY:
      std::__cxx11::string::_M_replace((ulong)&local_280,0,local_278,0x1aadd80);
      pcVar11 = "layout(rgba8i) uniform iimage2DMSArray";
      break;
    case SAMPLER_TYPE_SAMPLER2DMS:
      std::__cxx11::string::_M_replace((ulong)&local_280,0,local_278,0x1aadda6);
      pcVar11 = "layout(rgba8) uniform image2DMS";
      break;
    case SAMPLER_TYPE_SAMPLER2DMSARRAY:
      std::__cxx11::string::_M_replace((ulong)&local_280,0,local_278,0x1aaddc6);
      pcVar11 = "layout(rgba8) uniform image2DMSArray";
      break;
    case SAMPLER_TYPE_USAMPLER2DMS:
      std::__cxx11::string::_M_replace((ulong)&local_280,0,local_278,0x1aadded);
      pcVar11 = "layout(rgba8ui) uniform uimage2DMS";
      break;
    case SAMPLER_TYPE_USAMPLER2DMSARRAY:
      std::__cxx11::string::_M_replace((ulong)&local_280,0,local_278,0x1aade10);
      pcVar11 = "layout(rgba8ui) uniform uimage2DMSArray";
      break;
    default:
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,"Unrecognized sampler type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                 ,0x140);
      goto LAB_00a434b3;
    }
  }
  else {
    if (*local_260 != TEST_TYPE_TEXTURE) {
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,"Unrecognized test type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                 ,0x188);
      goto LAB_00a434b3;
    }
    std::__cxx11::string::_M_replace((ulong)&local_230,0,local_228,0x1aade20);
    switch(*sampler_type) {
    case SAMPLER_TYPE_ISAMPLER2DMS:
      std::__cxx11::string::_M_replace((ulong)&local_280,0,local_278,0x1aade3f);
      pcVar11 = "uniform isampler2DMS";
      break;
    case SAMPLER_TYPE_ISAMPLER2DMSARRAY:
      std::__cxx11::string::_M_replace((ulong)&local_280,0,local_278,0x1aade54);
      pcVar11 = "uniform isampler2DMSArray";
      break;
    case SAMPLER_TYPE_SAMPLER2DMS:
      std::__cxx11::string::_M_replace((ulong)&local_280,0,local_278,0x1aade6e);
      pcVar11 = "uniform sampler2DMS";
      break;
    case SAMPLER_TYPE_SAMPLER2DMSARRAY:
      std::__cxx11::string::_M_replace((ulong)&local_280,0,local_278,0x1aade82);
      pcVar11 = "uniform sampler2DMSArray";
      break;
    case SAMPLER_TYPE_USAMPLER2DMS:
      std::__cxx11::string::_M_replace((ulong)&local_280,0,local_278,0x1aade9b);
      pcVar11 = "uniform usampler2DMS";
      break;
    case SAMPLER_TYPE_USAMPLER2DMSARRAY:
      std::__cxx11::string::_M_replace((ulong)&local_280,0,local_278,0x1aadeb0);
      pcVar11 = "uniform usampler2DMSArray";
      break;
    default:
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,"Unrecognized sampler type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                 ,0x17f);
      goto LAB_00a434b3;
    }
  }
  std::__cxx11::string::_M_replace((ulong)&local_1d0,0,local_1c8,(ulong)pcVar11);
  std::__cxx11::string::_M_replace((ulong)&local_1f0,0,local_1e8,0x1aadc52);
  while (uVar6 = std::__cxx11::string::find((char *)&local_1f0,(ulong)local_210,0),
        uVar6 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&local_1f0,uVar6,local_208,(ulong)local_230);
  }
  while (uVar6 = std::__cxx11::string::find((char *)&local_1f0,(ulong)local_250,0),
        uVar6 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&local_1f0,uVar6,local_248,(ulong)local_1d0);
  }
  bVar3 = buildComputeProgram(this,local_1f0,true,true);
  if (bVar3) {
    iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var,iVar4);
    (**(code **)(lVar7 + 0x12c0))(this->m_po_id,0,0);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glShaderStorageBlockBinding() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                    ,0x1a4);
    (**(code **)(lVar7 + 0x48))(0x90d2,0,this->m_bo_id);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindBufferBase() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                    ,0x1a8);
    p_Var14 = local_260;
    _Var2 = *sampler_type;
    local_294 = 0x8d7c;
    if ((ulong)_Var2 < 4) {
      local_294 = *(undefined4 *)(&DAT_01aadb70 + (ulong)_Var2 * 4);
    }
    if ((_Var2 < SAMPLER_TYPE_USAMPLER2DMSARRAY) && ((0x15U >> (_Var2 & 0x1f) & 1) != 0)) {
      uVar12 = 0x9100;
      bVar3 = true;
    }
    else {
      uVar12 = 0x9102;
      bVar3 = false;
    }
    local_258 = &this->m_internalformat_n_samples_count;
    (**(code **)(lVar7 + 0x880))(uVar12,local_294,0x9380,1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetInternalformativ() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                    ,0x1ca);
    iVar4 = *local_258;
    if ((long)iVar4 < 1) {
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,
                 "Invalid value returned by glGetInternalformativ() for a GL_NUM_SAMPLE_COUNTS query"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                 ,0x1ce);
      __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pGVar8 = (GLint *)operator_new__((long)iVar4 * 4);
    this->m_internalformat_n_samples_data = pGVar8;
    (**(code **)(lVar7 + 0x880))(uVar12,local_294,0x80a9,iVar4,pGVar8);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetInternalformativ() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                    ,0x1d5);
    if (0 < *local_258) {
      pGVar1 = &this->m_to_id;
      lVar13 = 0;
      do {
        if (*p_Var14 == TEST_TYPE_IMAGE) {
          (**(code **)(lVar7 + 0x868))(0x906d,local_1b0);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glGetIntegerv(GL_MAX_IMAGE_SAMPLES) call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                          ,0x1e3);
          if (this->m_internalformat_n_samples_data[lVar13] <= (int)local_1b0._0_4_)
          goto LAB_00a42fcf;
        }
        else {
LAB_00a42fcf:
          (**(code **)(lVar7 + 0x6f8))(1,pGVar1);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glGenTextures() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                          ,0x1ea);
          (**(code **)(lVar7 + 0xb8))(uVar12,*pGVar1);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glBindTexture() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                          ,0x1ed);
          if (bVar3) {
            (**(code **)(lVar7 + 0x1390))
                      (0x9100,this->m_internalformat_n_samples_data[lVar13],local_294,
                       this->m_to_width,this->m_to_height,0);
            dVar5 = (**(code **)(lVar7 + 0x800))();
            iVar4 = 499;
            pcVar11 = "glTexStorage2DMultisample() call failed";
          }
          else {
            (**(code **)(lVar7 + 0x13a8))
                      (uVar12,this->m_internalformat_n_samples_data[lVar13],local_294,
                       this->m_to_width,this->m_to_height,this->m_to_depth,1);
            dVar5 = (**(code **)(lVar7 + 0x800))();
            iVar4 = 0x1fb;
            pcVar11 = "glTexStorage3DMultisample() call failed";
          }
          glu::checkError(dVar5,pcVar11,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                          ,iVar4);
          if (*p_Var14 == TEST_TYPE_IMAGE) {
            (**(code **)(lVar7 + 0x80))(0,*pGVar1,0,0,0,35000,local_294);
            dVar5 = (**(code **)(lVar7 + 0x800))();
            glu::checkError(dVar5,"glBindImageTexture() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                            ,0x206);
          }
          (**(code **)(lVar7 + 0x1680))(this->m_po_id);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glUseProgram() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                          ,0x20b);
          (**(code **)(lVar7 + 0x528))(1,1,1);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glDispatchCompute() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                          ,0x210);
          (**(code **)(lVar7 + 0xdb8))(0x200);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glMemoryBarrier() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                          ,0x213);
          piVar9 = (int *)(**(code **)(lVar7 + 0xcf8))(0x8892,35000);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glMapBuffer() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                          ,0x219);
          iVar4 = this->m_internalformat_n_samples_data[lVar13];
          if (*piVar9 != iVar4) {
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            this_00 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Value reported for the ",0x17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,local_280,(long)local_278);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," test [",7);
            std::ostream::operator<<(this_00,*piVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"]  is different from the expected one [",0x27);
            std::ostream::operator<<(this_00,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"].",2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar10,"Invalid value reported by ES SL function",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                       ,0x224);
            __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          (**(code **)(lVar7 + 0x1670))(0x8892);
          p_Var14 = local_260;
          (**(code **)(lVar7 + 0x480))(1,pGVar1);
          *pGVar1 = 0;
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glDeleteTextures() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                          ,0x22c);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < *local_258);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
    if (local_250 != local_240) {
      operator_delete(local_250,local_240[0] + 1);
    }
    if (local_280 != &local_270) {
      operator_delete(local_280,CONCAT71(uStack_26f,local_270) + 1);
    }
    if (local_230 != &local_220) {
      operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
    }
    return;
  }
  pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar10,"Could not link a test program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
             ,0x19c);
LAB_00a434b3:
  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderTextureImageSamplesTestBase::executeFunctionalTest(const _sampler_type& sampler_type,
															  const _test_type&	test_type)
{
	std::string cs_body;
	const char* cs_template_code = "#version 430\n"
								   "\n"
								   "#extension GL_ARB_shader_texture_image_samples : require\n"
								   "\n"
								   "layout(local_size_x = 1) in;\n"
								   "\n"
								   "buffer Result\n"
								   "{\n"
								   "    int samples;\n"
								   "};\n"
								   "\n"
								   "SAMPLER_TYPE data;\n"
								   "\n"
								   "void main()\n"
								   "{\n"
								   "    samples = SAMPLES_MODIFIER\n"
								   "}\n";

	/* Any program or shader objects lying around at this point? If so, release them
	 * before we proceed.
	 */
	deinitProgramAndShaderObjects();

	/* Construct the shader body */
	const std::string samples_modifier_token		  = "SAMPLES_MODIFIER";
	size_t			  samples_modifier_token_location = std::string::npos;
	std::string		  samples_modifier_token_value;
	std::string		  sampler_type_string;
	const std::string sampler_type_token		  = "SAMPLER_TYPE";
	size_t			  sampler_type_token_location = std::string::npos;
	std::string		  sampler_type_token_value;

	switch (test_type)
	{
	case TEST_TYPE_IMAGE:
	{
		samples_modifier_token_value = "imageSamples(data);\n";

		switch (sampler_type)
		{
		case SAMPLER_TYPE_ISAMPLER2DMS:
		{
			sampler_type_string		 = "iimage2DMS";
			sampler_type_token_value = "layout(rgba8i) uniform iimage2DMS";

			break;
		}

		case SAMPLER_TYPE_ISAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "iimage2DMSArray";
			sampler_type_token_value = "layout(rgba8i) uniform iimage2DMSArray";

			break;
		}

		case SAMPLER_TYPE_SAMPLER2DMS:
		{
			sampler_type_string		 = "image2DMS";
			sampler_type_token_value = "layout(rgba8) uniform image2DMS";

			break;
		}

		case SAMPLER_TYPE_SAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "image2DMSArray";
			sampler_type_token_value = "layout(rgba8) uniform image2DMSArray";

			break;
		}

		case SAMPLER_TYPE_USAMPLER2DMS:
		{
			sampler_type_string		 = "uimage2DMS";
			sampler_type_token_value = "layout(rgba8ui) uniform uimage2DMS";

			break;
		}

		case SAMPLER_TYPE_USAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "uimage2DMSArray";
			sampler_type_token_value = "layout(rgba8ui) uniform uimage2DMSArray";

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized sampler type");
		}
		} /* switch (sampler_type) */

		break;
	} /* case TEST_TYPE_IMAGE: */

	case TEST_TYPE_TEXTURE:
	{
		samples_modifier_token_value = "textureSamples(data);\n";

		switch (sampler_type)
		{
		case SAMPLER_TYPE_ISAMPLER2DMS:
		{
			sampler_type_string		 = "isampler2DMS";
			sampler_type_token_value = "uniform isampler2DMS";

			break;
		}

		case SAMPLER_TYPE_ISAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "isampler2DMSArray";
			sampler_type_token_value = "uniform isampler2DMSArray";

			break;
		}

		case SAMPLER_TYPE_SAMPLER2DMS:
		{
			sampler_type_string		 = "sampler2DMS";
			sampler_type_token_value = "uniform sampler2DMS";

			break;
		}

		case SAMPLER_TYPE_SAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "sampler2DMSArray";
			sampler_type_token_value = "uniform sampler2DMSArray";

			break;
		}

		case SAMPLER_TYPE_USAMPLER2DMS:
		{
			sampler_type_string		 = "usampler2DMS";
			sampler_type_token_value = "uniform usampler2DMS";

			break;
		}

		case SAMPLER_TYPE_USAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "usampler2DMSArray";
			sampler_type_token_value = "uniform usampler2DMSArray";

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized sampler type");
		}
		} /* switch (sampler_type) */

		break;
	} /* case TEST_TYPE_TEXTURE: */

	default:
	{
		TCU_FAIL("Unrecognized test type");
	}
	} /* switch (test_type) */

	cs_body = cs_template_code;

	while ((samples_modifier_token_location = cs_body.find(samples_modifier_token)) != std::string::npos)
	{
		cs_body.replace(samples_modifier_token_location, samples_modifier_token.length(), samples_modifier_token_value);
	}

	while ((sampler_type_token_location = cs_body.find(sampler_type_token)) != std::string::npos)
	{
		cs_body.replace(sampler_type_token_location, sampler_type_token.length(), sampler_type_token_value);
	}

	/* Build the compute program */
	if (!buildComputeProgram(cs_body.c_str(), true, /* should_link_po */
							 true))					/* should_succeed */
	{
		TCU_FAIL("Could not link a test program");
	}

	/* Set up SSBO */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.shaderStorageBlockBinding(m_po_id, 0, /* storageBlockIndex */
								 0);		 /* storageBlockBinding */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderStorageBlockBinding() call failed.");

	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, /* index */
					  m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	/* Determine what numbers of samples we can use for GL_RGBA8, GL_RGBA8I
	 * or GL_RGBA8UI internalformats. Specific choice depends on the sampler type
	 * requested bty the caller.
	 */
	glw::GLenum texture_internalformat = GL_NONE;
	glw::GLenum texture_target		   = GL_NONE;

	if (sampler_type == SAMPLER_TYPE_ISAMPLER2DMS || sampler_type == SAMPLER_TYPE_ISAMPLER2DMSARRAY)
	{
		texture_internalformat = GL_RGBA8I;
	}
	else if (sampler_type == SAMPLER_TYPE_SAMPLER2DMS || sampler_type == SAMPLER_TYPE_SAMPLER2DMSARRAY)
	{
		texture_internalformat = GL_RGBA8;
	}
	else
	{
		texture_internalformat = GL_RGBA8UI;
	}

	if (sampler_type == SAMPLER_TYPE_ISAMPLER2DMS || sampler_type == SAMPLER_TYPE_SAMPLER2DMS ||
		sampler_type == SAMPLER_TYPE_USAMPLER2DMS)
	{
		texture_target = GL_TEXTURE_2D_MULTISAMPLE;
	}
	else
	{
		texture_target = GL_TEXTURE_2D_MULTISAMPLE_ARRAY;
	}

	gl.getInternalformativ(texture_target, texture_internalformat, GL_NUM_SAMPLE_COUNTS, 1, /* bufSize */
						   &m_internalformat_n_samples_count);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() call failed.");

	if (m_internalformat_n_samples_count < 1)
	{
		TCU_FAIL("Invalid value returned by glGetInternalformativ() for a GL_NUM_SAMPLE_COUNTS query");
	}

	m_internalformat_n_samples_data = new glw::GLint[m_internalformat_n_samples_count];

	gl.getInternalformativ(texture_target, texture_internalformat, GL_SAMPLES, m_internalformat_n_samples_count,
						   m_internalformat_n_samples_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() call failed.");

	/* Iterate over all sample counts. For each iteration, set up texture storage,
	 * run one work-item which will store the value retrieved by one of the two new
	 * ES SL functions into the buffer object. Once that happens, map the buffer
	 * object storage contents into process space and validate the value */
	for (int n_value = 0; n_value < m_internalformat_n_samples_count; ++n_value)
	{
		if (test_type == TEST_TYPE_IMAGE)
		{
			/* Shader images do not necessarily support all sample counts. */
			int max_image_samples;

			gl.getIntegerv(GL_MAX_IMAGE_SAMPLES, &max_image_samples);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_MAX_IMAGE_SAMPLES) call failed.");

			if (m_internalformat_n_samples_data[n_value] > max_image_samples)
				continue;
		}

		gl.genTextures(1, &m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

		gl.bindTexture(texture_target, m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		if (texture_target == GL_TEXTURE_2D_MULTISAMPLE)
		{
			gl.texStorage2DMultisample(texture_target, m_internalformat_n_samples_data[n_value], texture_internalformat,
									   m_to_width, m_to_height, GL_FALSE); /* fixedsamplelocations */
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2DMultisample() call failed");
		}
		else
		{
			DE_ASSERT(texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

			gl.texStorage3DMultisample(texture_target, m_internalformat_n_samples_data[n_value], texture_internalformat,
									   m_to_width, m_to_height, m_to_depth, GL_TRUE); /* fixedsamplelocations */
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3DMultisample() call failed");
		}

		/* If we're running the "image" test, bind the texture to zeroth image unit */
		if (test_type == TEST_TYPE_IMAGE)
		{
			gl.bindImageTexture(0,			/* unit */
								m_to_id, 0, /* level */
								GL_FALSE,   /* layered */
								0,			/* lyer */
								GL_READ_ONLY, texture_internalformat);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture() call failed.");
		}

		/* Dispatch a compute request */
		gl.useProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		gl.dispatchCompute(1,  /* num_groups_x */
						   1,  /* num_groups_y */
						   1); /* num_groups_z */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute() call failed.");

		gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier() call failed.");

		/* Map the buffer object storage into process space */
		const void* bo_ptr		   = gl.mapBuffer(GL_ARRAY_BUFFER, GL_READ_ONLY);
		glw::GLint  expected_value = 0;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed");

		expected_value = m_internalformat_n_samples_data[n_value];

		if (*(int*)bo_ptr != expected_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Value reported for the " << sampler_type_string << " test ["
							   << *(int*)bo_ptr << "] "
												   " is different from the expected one ["
							   << expected_value << "]." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported by ES SL function");
		}

		/* Safe to unmap the BO at this point */
		gl.unmapBuffer(GL_ARRAY_BUFFER);

		gl.deleteTextures(1, &m_to_id);
		m_to_id = 0;
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed.");
	} /* for (all "n samples" values) */
}